

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElement::~IfcTransportElement(IfcTransportElement *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70 = 0x8e2348;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x58 = 0x8e2438;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.Representation.have = 0x8e2370;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.field_0x108 = 0x8e2398;
  *(undefined8 *)&this[-1].super_IfcElement.field_0x140 = 0x8e23c0;
  this[-1].CapacityByWeight.ptr = 4.60237168696755e-317;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x8e2410;
  puVar1 = *(undefined1 **)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x10;
  if (puVar1 != &(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x20) {
    operator_delete(puVar1);
  }
  IfcElement::~IfcElement
            ((IfcElement *)&this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70,
             &PTR_construction_vtable_24__008e2450);
  return;
}

Assistant:

IfcTransportElement() : Object("IfcTransportElement") {}